

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 SyBufferFormat(char *zBuf,sxu32 nLen,char *zFormat,...)

{
  char in_AL;
  sxi32 sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  sxu32 local_6c;
  undefined1 local_68 [4];
  sxu32 n;
  va_list ap;
  undefined1 local_48 [8];
  SyBlob sBlob;
  char *zFormat_local;
  sxu32 nLen_local;
  char *zBuf_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  sBlob._24_8_ = zFormat;
  sVar1 = SyBlobInitFromBuf((SyBlob *)local_48,zBuf,nLen - 1);
  if (sVar1 == 0) {
    ap[0].overflow_arg_area = local_128;
    ap[0]._0_8_ = &stack0x00000008;
    n = 0x30;
    local_68 = (undefined1  [4])0x18;
    FormatMount(6,local_48,(ProcConsumer)0x0,(void *)0x0,(sxu32 *)0x0,(char *)sBlob._24_8_,
                (__va_list_tag *)local_68);
    local_6c = (sxu32)sBlob.pBlob;
    sBlob.pBlob._4_4_ = sBlob.pBlob._4_4_ + 1;
    SyBlobAppend((SyBlob *)local_48,"",1);
    zBuf_local._4_4_ = local_6c;
  }
  else {
    zBuf_local._4_4_ = 0;
  }
  return zBuf_local._4_4_;
}

Assistant:

JX9_PRIVATE sxu32 SyBufferFormat(char *zBuf, sxu32 nLen, const char *zFormat, ...)
{
	SyBlob sBlob;
	va_list ap;
	sxu32 n;
#if defined(UNTRUST)	
	if( SX_EMPTY_STR(zFormat) ){
		return 0;
	}
#endif	
	if( SXRET_OK != SyBlobInitFromBuf(&sBlob, zBuf, nLen - 1) ){
		return 0;
	}		
	va_start(ap, zFormat);
	FormatMount(SXFMT_CONS_BLOB, &sBlob, 0, 0, 0, zFormat, ap);
	va_end(ap);
	n = SyBlobLength(&sBlob);
	/* Append the null terminator */
	sBlob.mByte++;
	SyBlobAppend(&sBlob, "\0", sizeof(char));
	return n;
}